

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O3

int __thiscall
TPZCompElHDiv<pzshape::TPZShapeTetra>::SideConnectLocId
          (TPZCompElHDiv<pzshape::TPZShapeTetra> *this,int node,int side)

{
  int iVar1;
  
  iVar1 = pztopology::TPZTetrahedron::NumSides(2);
  return iVar1 + node + side + -0xe;
}

Assistant:

int TPZCompElHDiv<TSHAPE>::SideConnectLocId(int node,int side) const {
#ifdef PZDEBUG
	if(TSHAPE::SideDimension(side)<= TSHAPE::Dimension - 2 || node >= NSideConnects(side)) {
		PZError << "TPZCompElHDiv<TSHAPE>::SideConnectLocId no connect associate " <<  endl;
		return -1;
	}
#endif

    return node+side-(TSHAPE::NSides-TSHAPE::NumSides(TSHAPE::Dimension-1)-1);
}